

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfChannelListAttribute.cpp
# Opt level: O2

void __thiscall
Imf_2_5::TypedAttribute<Imf_2_5::ChannelList>::writeValueTo
          (TypedAttribute<Imf_2_5::ChannelList> *this,OStream *os,int version)

{
  const_iterator cVar1;
  ConstIterator CVar2;
  
  cVar1._M_node = (_Base_ptr)ChannelList::begin(&this->_value);
  while( true ) {
    CVar2 = ChannelList::end(&this->_value);
    if ((const_iterator)cVar1._M_node == CVar2._i._M_node) break;
    Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(os,(char *)(cVar1._M_node + 1));
    Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(os,cVar1._M_node[9]._M_color);
    Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>
              (os,*(bool *)((long)&cVar1._M_node[9]._M_parent + 4));
    Xdr::pad<Imf_2_5::StreamIO,Imf_2_5::OStream>(os,3);
    Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(os,*(int *)&cVar1._M_node[9].field_0x4);
    Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(os,*(int *)&cVar1._M_node[9]._M_parent);
    cVar1._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar1._M_node);
  }
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(os,"");
  return;
}

Assistant:

void
ChannelListAttribute::writeValueTo (OStream &os, int version) const
{
    for (ChannelList::ConstIterator i = _value.begin();
	 i != _value.end();
	 ++i)
    {
	//
	// Write name
	//

	Xdr::write <StreamIO> (os, i.name());

	//
	// Write Channel struct
	//

	Xdr::write <StreamIO> (os, int (i.channel().type));
	Xdr::write <StreamIO> (os, i.channel().pLinear);
	Xdr::pad   <StreamIO> (os, 3);
	Xdr::write <StreamIO> (os, i.channel().xSampling);
	Xdr::write <StreamIO> (os, i.channel().ySampling);
    }

    //
    // Write end of list marker
    //

    Xdr::write <StreamIO> (os, "");
}